

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

times * __thiscall
lest::for_test<lest::times>(lest *this,tests *specification,texts *in,times *perform,int n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  int iVar4;
  times *ptVar5;
  int iVar6;
  fd_set *__exceptfds;
  fd_set *__writefds;
  int iVar7;
  undefined4 in_register_00000084;
  long *plVar8;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  test local_70;
  
  iVar6 = (int)perform;
  __exceptfds = (fd_set *)CONCAT71((int7)((ulong)perform >> 8),iVar6 < 1);
  if (iVar6 == -1 || iVar6 >= 1) {
    iVar7 = 0;
    paVar1 = &local_70.name.field_2;
    do {
      plVar8 = *(long **)this;
      while( true ) {
        plVar3 = *(long **)(this + 8);
        if (plVar8 == plVar3) break;
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char*>((string *)local_90,*plVar8,plVar8[1] + *plVar8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffffb8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)specification);
        iVar4 = select((int)(string *)local_90,(fd_set *)&stack0xffffffffffffffb8,__writefds,
                       __exceptfds,(timeval *)CONCAT44(in_register_00000084,n));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xffffffffffffffb8);
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
        if ((char)iVar4 == '\0') {
LAB_00110327:
          bVar2 = true;
        }
        else {
          local_70.name._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>((string *)&local_70,*plVar8,plVar8[1] + *plVar8)
          ;
          local_70.behaviour = (_func_void_env_ptr *)plVar8[4];
          ptVar5 = times::operator()((times *)in,&local_70);
          iVar4 = ptVar5->failures;
          bVar2 = (ptVar5->output).opt.abort;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70.name._M_dataplus._M_p != paVar1) {
            operator_delete(local_70.name._M_dataplus._M_p);
          }
          if ((0 < iVar4 & bVar2) == 0) goto LAB_00110327;
          bVar2 = false;
        }
        if (!bVar2) break;
        plVar8 = plVar8 + 5;
      }
      if (plVar8 != plVar3) {
        return (times *)in;
      }
      iVar7 = iVar7 + 1;
      __exceptfds = (fd_set *)(ulong)CONCAT31((int3)((ulong)perform >> 8),iVar6 <= iVar7);
    } while (iVar6 == -1 || iVar6 > iVar7);
  }
  return (times *)in;
}

Assistant:

Action & for_test( tests specification, texts in, Action & perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( tests::iterator pos = specification.begin(); pos != specification.end() ; ++pos )
        {
            test & testing = *pos;

            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return perform;
        }
    }
    return perform;
}